

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slab_cache.c
# Opt level: O0

slab * slab_merge(slab_cache *cache,slab *slab,slab *buddy)

{
  slab *psVar1;
  rlist *prVar2;
  size_t sVar3;
  slab *local_40;
  slab *merged;
  slab *buddy_local;
  slab *slab_local;
  slab_cache *cache_local;
  
  psVar1 = slab_buddy(cache,slab);
  if (psVar1 != buddy) {
    __assert_fail("slab_buddy(cache, slab) == buddy",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/slab_cache.c"
                  ,0x9f,"struct slab *slab_merge(struct slab_cache *, struct slab *, struct slab *)"
                 );
  }
  local_40 = slab;
  if (buddy < slab) {
    local_40 = buddy;
  }
  prVar2 = &buddy->next_in_list;
  prVar2->prev->next = (buddy->next_in_list).next;
  ((buddy->next_in_list).next)->prev = prVar2->prev;
  (buddy->next_in_list).next = prVar2;
  prVar2->prev = prVar2;
  cache->orders[buddy->order].stats.total = cache->orders[buddy->order].stats.total - buddy->size;
  local_40->order = local_40->order + '\x01';
  sVar3 = slab_order_size(cache,local_40->order);
  local_40->size = sVar3;
  return local_40;
}

Assistant:

static inline struct slab *
slab_merge(struct slab_cache *cache, struct slab *slab, struct slab *buddy)
{
	assert(slab_buddy(cache, slab) == buddy);
	struct slab *merged = slab > buddy ? buddy : slab;
	/** Remove the buddy from the free list. */
	slab_list_del(&cache->orders[buddy->order], buddy, next_in_list);
	merged->order++;
	merged->size = slab_order_size(cache, merged->order);
	return merged;
}